

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogEntryLookup * __thiscall
duckdb::Catalog::TryLookupEntry
          (CatalogEntryLookup *__return_storage_ptr__,Catalog *this,CatalogEntryRetriever *retriever
          ,string *schema,EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  ClientContext *context;
  AttachedDatabase *pAVar1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  bool bVar2;
  string *catalog_name;
  optional_ptr<duckdb::Catalog,_true> oVar3;
  CatalogType type;
  runtime_error *this_00;
  undefined3 in_register_00000089;
  pointer pCVar4;
  CatalogTransaction transaction;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  reference_set_t<SchemaCatalogEntry> schemas;
  value_type local_f8;
  undefined4 local_ec;
  undefined1 local_e8 [32];
  transaction_t local_c8;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_ec = CONCAT31(in_register_00000089,if_not_found);
  context = retriever->context;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  bVar2 = IsInvalidSchema(schema);
  if (bVar2) {
    pAVar1 = this->db;
    ::std::__cxx11::string::string
              ((string *)local_e8,anon_var_dwarf_4bacfca + 9,(allocator *)&local_f8);
    GetCatalogEntries((vector<duckdb::CatalogSearchEntry,_true> *)&local_c0,retriever,
                      &(pAVar1->super_CatalogEntry).name,(string *)local_e8);
    ::std::__cxx11::string::~string((string *)local_e8);
    for (pCVar4 = local_c0.
                  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 != local_c0.
                  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pCVar4 = pCVar4 + 1) {
      CatalogTransaction::CatalogTransaction((CatalogTransaction *)local_e8,this,context);
      transaction_00.context.ptr = (ClientContext *)local_e8._8_8_;
      transaction_00.db.ptr = (DatabaseInstance *)local_e8._0_8_;
      transaction_00.transaction.ptr = (Transaction *)local_e8._16_8_;
      transaction_00.transaction_id = local_e8._24_8_;
      transaction_00.start_time = local_c8;
      TryLookupEntryInternal(__return_storage_ptr__,this,transaction_00,&pCVar4->schema,lookup_info)
      ;
      if ((__return_storage_ptr__->entry).ptr != (CatalogEntry *)0x0) {
        ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
        ~vector(&local_c0);
        goto LAB_002261c0;
      }
      if ((__return_storage_ptr__->schema).ptr != (SchemaCatalogEntry *)0x0) {
        local_f8._M_data =
             optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator*
                       (&__return_storage_ptr__->schema);
        ::std::__detail::
        _Insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
        ::insert((_Insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                  *)&local_68,&local_f8);
      }
      ErrorData::~ErrorData(&__return_storage_ptr__->error);
    }
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
              (&local_c0);
  }
  else {
    CatalogTransaction::CatalogTransaction((CatalogTransaction *)local_e8,this,context);
    transaction_01.context.ptr = (ClientContext *)local_e8._8_8_;
    transaction_01.db.ptr = (DatabaseInstance *)local_e8._0_8_;
    transaction_01.transaction.ptr = (Transaction *)local_e8._16_8_;
    transaction_01.transaction_id = local_e8._24_8_;
    transaction_01.start_time = local_c8;
    TryLookupEntryInternal(__return_storage_ptr__,this,transaction_01,schema,lookup_info);
    if ((__return_storage_ptr__->entry).ptr != (CatalogEntry *)0x0) goto LAB_002261c0;
    if ((__return_storage_ptr__->schema).ptr != (SchemaCatalogEntry *)0x0) {
      local_c0.
      super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator*
                              (&__return_storage_ptr__->schema);
      ::std::__detail::
      _Insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert((_Insert<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                *)&local_68,(value_type *)&local_c0);
    }
    ErrorData::~ErrorData(&__return_storage_ptr__->error);
  }
  if ((char)local_ec == '\x01') {
    (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
    (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
    ErrorData::ErrorData(&__return_storage_ptr__->error);
  }
  else {
    catalog_name = GetDefaultCatalog_abi_cxx11_(retriever);
    oVar3 = GetCatalogEntry(context,catalog_name);
    if (oVar3.ptr == (Catalog *)0x0) {
      ::std::__cxx11::string::string
                ((string *)local_e8,"%s with name %s does not exist!",(allocator *)&local_f8);
      CatalogTypeToString_abi_cxx11_(&local_88,(duckdb *)(ulong)lookup_info->catalog_type,type);
      ::std::__cxx11::string::string((string *)&local_a8,(string *)lookup_info->name);
      CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                ((CatalogException *)&local_c0,(string *)local_e8,&local_88,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)local_e8);
      (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
      ErrorData::ErrorData(&__return_storage_ptr__->error,(exception *)&local_c0);
      this_00 = (runtime_error *)&local_c0;
    }
    else {
      CreateMissingEntryException
                ((CatalogException *)local_e8,retriever,lookup_info,
                 (reference_set_t<SchemaCatalogEntry> *)&local_68);
      (__return_storage_ptr__->schema).ptr = (SchemaCatalogEntry *)0x0;
      (__return_storage_ptr__->entry).ptr = (CatalogEntry *)0x0;
      ErrorData::ErrorData(&__return_storage_ptr__->error,(exception *)local_e8);
      this_00 = (runtime_error *)local_e8;
    }
    ::std::runtime_error::~runtime_error(this_00);
  }
LAB_002261c0:
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntry(CatalogEntryRetriever &retriever, const string &schema,
                                           const EntryLookupInfo &lookup_info, OnEntryNotFound if_not_found) {
	auto &context = retriever.GetContext();
	reference_set_t<SchemaCatalogEntry> schemas;
	if (IsInvalidSchema(schema)) {
		// try all schemas for this catalog
		auto entries = GetCatalogEntries(retriever, GetName(), INVALID_SCHEMA);
		for (auto &entry : entries) {
			auto &candidate_schema = entry.schema;
			auto transaction = GetCatalogTransaction(context);
			auto result = TryLookupEntryInternal(transaction, candidate_schema, lookup_info);
			if (result.Found()) {
				return result;
			}
			if (result.schema) {
				schemas.insert(*result.schema);
			}
		}
	} else {
		auto transaction = GetCatalogTransaction(context);
		auto result = TryLookupEntryInternal(transaction, schema, lookup_info);
		if (result.Found()) {
			return result;
		}
		if (result.schema) {
			schemas.insert(*result.schema);
		}
	}

	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		return {nullptr, nullptr, ErrorData()};
	}
	// Check if the default database is actually attached. CreateMissingEntryException will throw binder exception
	// otherwise.
	if (!GetCatalogEntry(context, GetDefaultCatalog(retriever))) {
		auto except = CatalogException("%s with name %s does not exist!",
		                               CatalogTypeToString(lookup_info.GetCatalogType()), lookup_info.GetEntryName());
		return {nullptr, nullptr, ErrorData(except)};
	} else {
		auto except = CreateMissingEntryException(retriever, lookup_info, schemas);
		return {nullptr, nullptr, ErrorData(except)};
	}
}